

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeIterator.cpp
# Opt level: O2

NodeIterator * __thiscall NodeIterator::operator++(NodeIterator *this)

{
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *psVar1;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *psVar2;
  
  if (this->forkNode == (ForkNode *)0x0) {
    if ((this->exitNode != (ExitNode *)0x0) &&
       (psVar2 = ExitNode::joinSuccessors(this->exitNode),
       (_Rb_tree_header *)(this->joinSuccessorsIterator)._M_node !=
       &(psVar2->_M_t)._M_impl.super__Rb_tree_header)) {
      std::_Rb_tree_const_iterator<JoinNode_*>::operator++(&this->joinSuccessorsIterator);
      return this;
    }
  }
  else {
    psVar1 = ForkNode::forkSuccessors(this->forkNode);
    if ((_Rb_tree_header *)(this->forkSuccessorsIterator)._M_node !=
        &(psVar1->_M_t)._M_impl.super__Rb_tree_header) {
      std::_Rb_tree_const_iterator<EntryNode_*>::operator++(&this->forkSuccessorsIterator);
      return this;
    }
  }
  std::_Rb_tree_const_iterator<Node_*>::operator++(&this->successorsIterator);
  return this;
}

Assistant:

NodeIterator &NodeIterator::operator++() {
    if (forkNode) {
        if (forkSuccessorsIterator != forkNode->forkSuccessors().end()) {
            ++forkSuccessorsIterator;
            return *this;
        }
    } else if (exitNode) {
        if (joinSuccessorsIterator != exitNode->joinSuccessors().end()) {
            ++joinSuccessorsIterator;
            return *this;
        }
    }
    ++successorsIterator;
    return *this;
}